

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeDeviceImportExternalSemaphoreExtPrologue
          (ZEParameterValidation *this,ze_device_handle_t hDevice,
          ze_external_semaphore_ext_desc_t *desc,ze_external_semaphore_ext_handle_t *phSemaphore)

{
  ze_result_t zVar1;
  
  if (hDevice != (ze_device_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((phSemaphore != (ze_external_semaphore_ext_handle_t *)0x0 &&
         desc != (ze_external_semaphore_ext_desc_t *)0x0) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, desc->flags < 0x200)) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeDeviceImportExternalSemaphoreExtPrologue(
        ze_device_handle_t hDevice,                     ///< [in] The device handle.
        const ze_external_semaphore_ext_desc_t* desc,   ///< [in] The pointer to external semaphore descriptor.
        ze_external_semaphore_ext_handle_t* phSemaphore ///< [out] The handle of the external semaphore imported.
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phSemaphore )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x1ff < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }